

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QFileSystemModel::setFilter(QFileSystemModel *this,Filters filters)

{
  QFlagsStorageHelper<QDir::Filter,_4> QVar1;
  QFileSystemModelPrivate *this_00;
  
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  QVar1.super_QFlagsStorage<QDir::Filter>.i =
       (QFlagsStorage<QDir::Filter>)
       (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.
       super_QFlagsStorage<QDir::Filter>.i;
  if (QVar1.super_QFlagsStorage<QDir::Filter>.i ==
      (QFlagsStorage<QDir::Filter>)
      filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i) {
    return;
  }
  (this_00->filters).super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i
       = (Int)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.super_QFlagsStorage<QDir::Filter>.i
  ;
  if (((byte)((uint)filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                    super_QFlagsStorage<QDir::Filter>.i >> 0xb) & 1) !=
      ((byte)((uint)QVar1.super_QFlagsStorage<QDir::Filter>.i >> 0xb) & 1)) {
    QFileSystemModelPrivate::rebuildNameFilterRegexps(this_00);
  }
  this_00->forceSort = true;
  QFileSystemModelPrivate::delayedSort(this_00);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }